

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtObj.c
# Opt level: O1

newtRef NewtMakeSlotsObj(newtRefArg r,uint32_t n,uint16_t type)

{
  newtObjRef pnVar1;
  undefined1 *puVar2;
  newtObjRef pnVar3;
  ulong uVar4;
  
  pnVar1 = NewtObjAlloc(r,n * 8,type | 1,false);
  if (pnVar1 == (newtObjRef)0x0) {
    puVar2 = (undefined1 *)0x2;
  }
  else {
    pnVar3 = pnVar1 + 1;
    if (((pnVar1->header).flags & 0x40) == 0) {
      pnVar3 = *(newtObjRef *)&pnVar3->header;
    }
    if (n != 0) {
      uVar4 = 0;
      do {
        *(undefined8 *)(&(pnVar3->header).size + uVar4 * 2) = 0xfff2;
        uVar4 = uVar4 + 1;
      } while (n != uVar4);
    }
    puVar2 = (undefined1 *)((long)&(pnVar1->header).size + 1);
  }
  return (newtRef)puVar2;
}

Assistant:

newtRef NewtMakeSlotsObj(newtRefArg r, uint32_t n, uint16_t type)
{
    newtObjRef	obj;
    uint32_t	size;
    
    size = sizeof(newtRef) * n;
    obj = NewtObjAlloc(r, size, kNewtObjSlotted | type, false);
    
    if (obj != NULL)
    {
        newtRef *	slots;
        uint32_t	i;
        
        slots = NewtObjToSlots(obj);
        
        for (i = 0; i < n; i++)
        {
            slots[i] = kNewtRefUnbind;
        }
        
        return NewtMakePointer(obj);
    }
    
    return kNewtRefNIL;
}